

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cc
# Opt level: O1

bool __thiscall Tester::testFile(Tester *this,string *filename)

{
  ostream *this_00;
  pointer pcVar1;
  bool bVar2;
  error_category *peVar3;
  char *__end;
  Message *m;
  Message *pMVar4;
  error_code eVar5;
  BufferedReport expected;
  BufferedReport actual;
  Parser p;
  stringstream sstr;
  DifferenceReport diff;
  string local_4e0;
  BufferedReport local_4c0;
  BufferedReport local_4a0;
  string local_480;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_460;
  size_type local_458;
  size_type local_450;
  undefined8 uStack_448;
  Parser local_440;
  undefined1 local_3c0 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_3b0 [7];
  ios_base local_340 [264];
  undefined1 local_238 [16];
  undefined1 local_228 [16];
  Message *local_218;
  
  local_4a0.super_Report._vptr_Report = (_func_int **)&PTR__BufferedReport_001b0268;
  local_4a0.messages_.
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4a0.messages_.
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4a0.messages_.
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  compileFile(this,filename,&local_4a0.super_Report);
  local_4c0.super_Report._vptr_Report = (_func_int **)&PTR__BufferedReport_001b0268;
  local_4c0.messages_.
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_4c0.messages_.
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_4c0.messages_.
  super__Vector_base<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pcVar1 = (filename->_M_dataplus)._M_p;
  local_480._M_dataplus._M_p = (pointer)&local_480.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_480,pcVar1,pcVar1 + filename->_M_string_length);
  std::ifstream::ifstream(local_238,(string *)filename,_S_in);
  std::__cxx11::stringstream::stringstream((stringstream *)local_3c0);
  this_00 = (ostream *)(local_3c0 + 0x10);
  std::ostream::operator<<(this_00,(streambuf *)local_228);
  std::__cxx11::stringbuf::str();
  if (local_460 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)&local_450) {
    local_4e0.field_2._8_8_ = uStack_448;
    local_4e0._M_dataplus._M_p = (pointer)&local_4e0.field_2;
  }
  else {
    local_4e0._M_dataplus._M_p = (pointer)local_460;
  }
  local_4e0.field_2._M_allocated_capacity = local_450;
  local_4e0._M_string_length = local_458;
  std::__cxx11::stringstream::~stringstream((stringstream *)local_3c0);
  std::ios_base::~ios_base(local_340);
  std::ifstream::~ifstream(local_238);
  flowtest::Parser::Parser(&local_440,&local_480,&local_4e0);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_4e0._M_dataplus._M_p != &local_4e0.field_2) {
    operator_delete(local_4e0._M_dataplus._M_p,local_4e0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_480._M_dataplus._M_p != &local_480.field_2) {
    operator_delete(local_480._M_dataplus._M_p,local_480.field_2._M_allocated_capacity + 1);
  }
  eVar5 = flowtest::Parser::parse(&local_440,&local_4c0.super_Report);
  peVar3 = eVar5._M_cat;
  if (eVar5._M_value == 0) {
    flow::diagnostics::difference((DifferenceReport *)local_238,&local_4a0,&local_4c0);
    if (local_238._0_8_ != local_238._8_8_) {
      pMVar4 = (Message *)local_238._0_8_;
      do {
        local_3c0._0_8_ = this_00;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"Missing: {}","");
        reportError<flow::diagnostics::Message_const&>(this,(string *)local_3c0,pMVar4);
        if ((ostream *)local_3c0._0_8_ != this_00) {
          operator_delete((void *)local_3c0._0_8_,local_3b0[0]._M_allocated_capacity + 1);
        }
        pMVar4 = pMVar4 + 1;
      } while (pMVar4 != (Message *)local_238._8_8_);
    }
    if ((Message *)local_228._8_8_ != local_218) {
      pMVar4 = (Message *)local_228._8_8_;
      do {
        local_3c0._0_8_ = this_00;
        std::__cxx11::string::_M_construct<char_const*>((string *)local_3c0,"Superfluous: {}","");
        reportError<flow::diagnostics::Message_const&>(this,(string *)local_3c0,pMVar4);
        if ((ostream *)local_3c0._0_8_ != this_00) {
          operator_delete((void *)local_3c0._0_8_,local_3b0[0]._M_allocated_capacity + 1);
        }
        pMVar4 = pMVar4 + 1;
      } while (pMVar4 != local_218);
    }
    bVar2 = flow::diagnostics::BufferedReport::operator==(&local_4a0,&local_4c0);
    std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>::~vector
              ((vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_> *)
               (local_228 + 8));
    std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>::~vector
              ((vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_> *)
               local_238);
  }
  else {
    local_238._0_8_ = (Message *)local_228;
    std::__cxx11::string::_M_construct<char_const*>((string *)local_238,"Parse Error({}): {}","");
    local_460 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)(**(code **)(*(long *)peVar3 + 0x10))(peVar3);
    (**(code **)(*(long *)peVar3 + 0x20))(local_3c0,peVar3,eVar5._M_value);
    reportError<char_const*,std::__cxx11::string>
              (this,(string *)local_238,(char **)&local_460,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_3c0);
    if ((ostream *)local_3c0._0_8_ != this_00) {
      operator_delete((void *)local_3c0._0_8_,local_3b0[0]._M_allocated_capacity + 1);
    }
    if ((Message *)local_238._0_8_ != (Message *)local_228) {
      operator_delete((void *)local_238._0_8_,local_228._0_8_ + 1);
    }
    bVar2 = false;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440.lexer_.stringValue_._M_dataplus._M_p != &local_440.lexer_.stringValue_.field_2) {
    operator_delete(local_440.lexer_.stringValue_._M_dataplus._M_p,
                    local_440.lexer_.stringValue_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440.lexer_.source_._M_dataplus._M_p != &local_440.lexer_.source_.field_2) {
    operator_delete(local_440.lexer_.source_._M_dataplus._M_p,
                    local_440.lexer_.source_.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_440.lexer_.filename_._M_dataplus._M_p != &local_440.lexer_.filename_.field_2) {
    operator_delete(local_440.lexer_.filename_._M_dataplus._M_p,
                    local_440.lexer_.filename_.field_2._M_allocated_capacity + 1);
  }
  local_4c0.super_Report._vptr_Report = (_func_int **)&PTR__BufferedReport_001b0268;
  std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>::~vector
            (&local_4c0.messages_);
  local_4a0.super_Report._vptr_Report = (_func_int **)&PTR__BufferedReport_001b0268;
  std::vector<flow::diagnostics::Message,_std::allocator<flow::diagnostics::Message>_>::~vector
            (&local_4a0.messages_);
  return bVar2;
}

Assistant:

bool Tester::testFile(const std::string& filename) {
  flow::diagnostics::BufferedReport actual;
  compileFile(filename, &actual);

  flow::diagnostics::BufferedReport expected;
  Parser p(filename, readFile(filename));
  std::error_code ec = p.parse(&expected);
  if (ec) {
    reportError("Parse Error({}): {}", ec.category().name(), ec.message());
    return false;
  }

  flow::diagnostics::DifferenceReport diff = flow::diagnostics::difference(actual, expected);
  for (const Message& m : diff.first)
    reportError("Missing: {}", m);
  for (const Message& m : diff.second)
    reportError("Superfluous: {}", m);

  if (actual != expected)
    return false;

  return true;
}